

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Permutazione.cpp
# Opt level: O2

long __thiscall Permutazione::random(Permutazione *this)

{
  unsigned_short uVar1;
  unsigned_short *puVar2;
  int iVar3;
  unsigned_short *puVar4;
  unsigned_short j;
  ulong uVar5;
  
  puVar4 = this->individuo;
  for (uVar5 = 0; uVar5 < this->dimensione; uVar5 = uVar5 + 1) {
    puVar4[uVar5] = (unsigned_short)uVar5;
  }
  for (uVar5 = (ulong)(this->dimensione - 1 & 0xffff); (short)uVar5 != 0; uVar5 = uVar5 - 1) {
    iVar3 = Random::randIntU(&genRand,0,(int)uVar5);
    puVar2 = this->individuo;
    puVar4 = (unsigned_short *)(long)iVar3;
    uVar1 = puVar2[(long)puVar4];
    puVar2[(long)puVar4] = puVar2[uVar5];
    puVar2[uVar5] = uVar1;
  }
  return (long)puVar4;
}

Assistant:

void Permutazione::random() {
	for (unsigned short j = 0; j < dimensione; j++) {
		individuo[j] = j;
	}

	for (unsigned short k = dimensione - 1; k > 0; k--) {
		int valoreRandom = genRand.randIntU(0, k);

		unsigned short tmp = individuo[valoreRandom];
		individuo[valoreRandom] = individuo[k];
		individuo[k] = tmp;
	}
}